

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

void smf_rewind(smf_t *smf)

{
  smf_track_t *track_00;
  smf_event_t *psVar1;
  smf_event_t *event;
  smf_track_t *track;
  int i;
  smf_t *smf_local;
  
  if (smf == (smf_t *)0x0) {
    __assert_fail("smf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,900,"void smf_rewind(smf_t *)");
  }
  smf->last_seek_position = 0.0;
  track._4_4_ = 1;
  while( true ) {
    if (smf->number_of_tracks < track._4_4_) {
      return;
    }
    track_00 = smf_get_track_by_number(smf,track._4_4_);
    if (track_00 == (smf_track_t *)0x0) break;
    if (track_00->number_of_events < 1) {
      track_00->next_event_number = -1;
      track_00->time_of_next_event = 0;
    }
    else {
      track_00->next_event_number = 1;
      psVar1 = smf_peek_next_event_from_track(track_00);
      if (psVar1 == (smf_event_t *)0x0) {
        __assert_fail("event",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x390,"void smf_rewind(smf_t *)");
      }
      track_00->time_of_next_event = psVar1->time_pulses;
    }
    track._4_4_ = track._4_4_ + 1;
  }
  __assert_fail("track != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x38b,"void smf_rewind(smf_t *)");
}

Assistant:

void
smf_rewind(smf_t *smf)
{
	int i;
	smf_track_t *track = NULL;
	smf_event_t *event;

	assert(smf);

	smf->last_seek_position = 0.0;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track != NULL);

		if (track->number_of_events > 0) {
			track->next_event_number = 1;
			event = smf_peek_next_event_from_track(track);
			assert(event);
			track->time_of_next_event = event->time_pulses;
		} else {
			track->next_event_number = -1;
			track->time_of_next_event = 0;
#if 0
			g_warning("Warning: empty track.");
#endif
		}
	}
}